

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

void nsync_maybe_merge_conditions_(nsync_dll_element_ *p,nsync_dll_element_ *n)

{
  int iVar1;
  nsync_dll_element_ *n_local;
  nsync_dll_element_ *p_local;
  
  if (p == (nsync_dll_element_ *)0x0) {
    return;
  }
  if (n == (nsync_dll_element_ *)0x0) {
    return;
  }
  if (*(long *)((long)p->container + 0x50) == 0) {
    return;
  }
  if (*(long *)((long)p->container + 0x50) == *(long *)((long)n->container + 0x50)) {
    if (*(long *)((long)p->container + 0x58) != *(long *)((long)n->container + 0x58)) {
      if (*(long *)((long)p->container + 0x60) == 0) {
        return;
      }
      iVar1 = (**(code **)((long)p->container + 0x60))
                        (*(undefined8 *)((long)p->container + 0x58),
                         *(undefined8 *)((long)n->container + 0x58));
      if (iVar1 == 0) {
        return;
      }
    }
    nsync_dll_splice_after_
              ((nsync_dll_element_ *)((long)p->container + 0x68),
               (nsync_dll_element_ *)((long)n->container + 0x68));
    return;
  }
  return;
}

Assistant:

void nsync_maybe_merge_conditions_ (nsync_dll_element_ *p, nsync_dll_element_ *n) {
	if (p != NULL && n != NULL &&
	    WAIT_CONDITION_EQ (&DLL_WAITER (p)->cond, &DLL_WAITER (n)->cond)) {
		nsync_dll_splice_after_ (&DLL_WAITER (p)->same_condition,
				  &DLL_WAITER (n)->same_condition);
	}
}